

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid_36_c.c
# Opt level: O0

char * hy36encode(uint width,int value,char *result)

{
  char *pcVar1;
  int i;
  char *result_local;
  int value_local;
  uint width_local;
  
  if (width == 4) {
    if (-1000 < value) {
      if (value < 10000) {
        pcVar1 = digits_upper();
        encode_pure(pcVar1,10,4,value,result);
        return (char *)0x0;
      }
      if (value + -10000 < 0x128280) {
        pcVar1 = digits_upper();
        encode_pure(pcVar1,0x24,0,value + 0x6f770,result);
        return (char *)0x0;
      }
      if (value + -0x12a990 < 0x128280) {
        pcVar1 = digits_lower();
        encode_pure(pcVar1,0x24,0,value + -0xb8b10,result);
        return (char *)0x0;
      }
    }
  }
  else {
    if (width != 5) {
      fill_with_stars(width,result);
      pcVar1 = unsupported_width();
      return pcVar1;
    }
    if (-10000 < value) {
      if (value < 100000) {
        pcVar1 = digits_upper();
        encode_pure(pcVar1,10,5,value,result);
        return (char *)0x0;
      }
      if (value + -100000 < 0x29a5a00) {
        pcVar1 = digits_upper();
        encode_pure(pcVar1,0x24,0,value + 0xfec360,result);
        return (char *)0x0;
      }
      if (value + -0x29be0a0 < 0x29a5a00) {
        pcVar1 = digits_lower();
        encode_pure(pcVar1,0x24,0,value + -0x19b96a0,result);
        return (char *)0x0;
      }
    }
  }
  fill_with_stars(width,result);
  pcVar1 = value_out_of_range();
  return pcVar1;
}

Assistant:

const char*
hy36encode(unsigned width, int value, char* result)
{
  int i = value;
  if (width == 4U) {
    if (i >= -999) {
      if (i < 10000) {
        encode_pure(digits_upper(), 10U, 4U, i, result);
        return 0;
      }
      i -= 10000;
      if (i < 1213056 /* 26*36**3 */) {
        i += 466560 /* 10*36**3 */;
        encode_pure(digits_upper(), 36U, 0U, i, result);
        return 0;
      }
      i -= 1213056;
      if (i < 1213056) {
        i += 466560;
        encode_pure(digits_lower(), 36U, 0U, i, result);
        return 0;
      }
    }
  }
  else if (width == 5U) {
    if (i >= -9999) {
      if (i < 100000) {
        encode_pure(digits_upper(), 10U, 5U, i, result);
        return 0;
      }
      i -= 100000;
      if (i < 43670016 /* 26*36**4 */) {
        i += 16796160 /* 10*36**4 */;
        encode_pure(digits_upper(), 36U, 0U, i, result);
        return 0;
      }
      i -= 43670016;
      if (i < 43670016) {
        i += 16796160;
        encode_pure(digits_lower(), 36U, 0U, i, result);
        return 0;
      }
    }
  }
  else {
    fill_with_stars(width, result);
    return unsupported_width();
  }
  fill_with_stars(width, result);
  return value_out_of_range();
}